

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cc
# Opt level: O1

bool __thiscall xLearn::Checker::check_cmd(Checker *this,HyperParam *hyper_param)

{
  bool bVar1;
  string local_28;
  
  if ((long)(this->args_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->args_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x20) {
    option_help_abi_cxx11_(&local_28,this);
    puts(local_28._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_28);
    exit(0);
  }
  if (this->is_train_ == true) {
    bVar1 = check_train_options(this,hyper_param);
    return bVar1;
  }
  bVar1 = check_prediction_options(this,hyper_param);
  return bVar1;
}

Assistant:

bool Checker::check_cmd(HyperParam& hyper_param) {
  // Do not have any args
  if (args_.size() == 1) {
    printf("%s\n", option_help().c_str());
    exit(0);
  }
  // Parse and check argument
  if (is_train_) {
    return check_train_options(hyper_param);
  } else {
    return check_prediction_options(hyper_param);
  }
}